

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_arith2(dill_stream s,int op,int subop,int dest,int src)

{
  int in_ECX;
  int in_ESI;
  int in_R8D;
  int rex1_1;
  int rex;
  int rex2;
  int rex1;
  int tmp_dest;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  if (in_ESI == 0) {
    uVar2 = 8;
    uVar1 = 8;
    iVar3 = in_ECX;
    if (3 < in_ECX) {
      iVar3 = 0;
    }
    if (7 < in_R8D) {
      uVar2 = 9;
    }
    BYTE_OUT3R((dill_stream)CONCAT44(iVar3,uVar2),8,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    x86_64_seti((dill_stream)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (7 < in_R8D) {
      uVar1 = uVar1 | 4;
    }
    if (7 < iVar3) {
      uVar1 = uVar1 | 1;
    }
    BYTE_OUT3R((dill_stream)CONCAT44(iVar3,uVar2),uVar1,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    if (iVar3 != in_ECX) {
      x86_64_pmov((dill_stream)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
    }
  }
  else {
    uVar1 = 8;
    if (in_R8D != in_ECX) {
      in_stack_ffffffffffffffd4 = 8;
      if (7 < in_ECX) {
        in_stack_ffffffffffffffd4 = 9;
      }
      if (7 < in_R8D) {
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 | 4;
      }
      BYTE_OUT2R((dill_stream)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,8,in_stack_ffffffffffffffd4);
    }
    if (7 < in_ECX) {
      uVar1 = uVar1 | 1;
    }
    BYTE_OUT2R((dill_stream)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,uVar1,in_stack_ffffffffffffffd4);
  }
  return;
}

Assistant:

extern void
x86_64_arith2(dill_stream s, int op, int subop, int dest, int src)
{
    if (op == 0) {
        int tmp_dest = dest;
        int rex1 = REX_W, rex2 = REX_W;
        /* must be not */
        if (dest >= ESP) {
            tmp_dest = EAX;
        }
        if (src > RDI)
            rex1 |= REX_B;
        BYTE_OUT3R(s, rex1, 0x83, ModRM(0x3, 0x7, src), 0); /* cmp */
        x86_64_seti(s, tmp_dest, 0);
        if (src > RDI)
            rex2 |= REX_R;
        if (tmp_dest > RDI)
            rex2 |= REX_B;
        BYTE_OUT3R(s, rex2, 0x0f, 0x94,
                   ModRM(0x3, src, tmp_dest)); /* sete dest */
        if (tmp_dest != dest) {
            x86_64_movi(s, dest, tmp_dest);
        }
    } else {
        int rex = REX_W;
        if (src != dest) {
            int rex1 = rex;
            if (dest > RDI)
                rex1 |= REX_B;
            if (src > RDI)
                rex1 |= REX_R;
            BYTE_OUT2R(s, rex1, MOV32, ModRM(0x3, src, dest));
        }
        if (dest > RDI)
            rex |= REX_B;
        BYTE_OUT2R(s, rex, op, ModRM(0x3, subop, dest));
    }
}